

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

uint8_t __thiscall flexbuffers::Builder::Align(Builder *this,BitWidth alignment)

{
  size_type_conflict buf_size;
  size_t __n;
  value_type_conflict1 local_29;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  const_iterator local_20;
  uint local_18;
  BitWidth local_14;
  uint byte_width;
  BitWidth alignment_local;
  Builder *this_local;
  
  local_18 = 1 << ((byte)alignment & 0x1f);
  local_14 = alignment;
  _byte_width = this;
  local_28._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->buf_);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_20,&local_28);
  buf_size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buf_);
  __n = flatbuffers::PaddingBytes(buf_size,(ulong)local_18);
  local_29 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            (&this->buf_,local_20,__n,&local_29);
  return (uint8_t)local_18;
}

Assistant:

uint8_t Align(BitWidth alignment) {
    auto byte_width = 1U << alignment;
    buf_.insert(buf_.end(), flatbuffers::PaddingBytes(buf_.size(), byte_width),
                0);
    return static_cast<uint8_t>(byte_width);
  }